

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::Shader::Shader(Shader *this,Functions *gl,ShaderType shaderType)

{
  GLuint GVar1;
  GLenum err;
  TestError *this_00;
  
  this->m_gl = gl;
  this->m_shader = 0;
  ShaderInfo::ShaderInfo(&this->m_info);
  (this->m_info).type = shaderType;
  GVar1 = (*this->m_gl->createShader)(getGLShaderType::s_typeMap[shaderType]);
  this->m_shader = GVar1;
  err = (*this->m_gl->getError)();
  checkError(err,"glCreateShader()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x38);
  if (this->m_shader != 0) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_shader",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0x39);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Shader::Shader (const glw::Functions& gl, ShaderType shaderType)
	: m_gl		(gl)
	, m_shader	(0)
{
	m_info.type	= shaderType;
	m_shader	= m_gl.createShader(getGLShaderType(shaderType));
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateShader()");
	TCU_CHECK(m_shader);
}